

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  double x;
  undefined8 in_RAX;
  int i;
  long lVar1;
  int iVar2;
  double y;
  int local_28;
  int width;
  
  if (_glfwInitialized == '\0') {
    iVar2 = 0x10001;
LAB_001079d5:
    _glfwInputError(iVar2,(char *)0x0);
    return;
  }
  if (mode == 0x33003) {
    if (handle[0x39] == (GLFWwindow)(value != 0)) {
      return;
    }
    if (value == 0) {
      for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
        if (handle[lVar1 + 0x54] == (GLFWwindow)0x3) {
          handle[lVar1 + 0x54] = (GLFWwindow)0x0;
        }
      }
    }
    handle[0x39] = (GLFWwindow)(value != 0);
    return;
  }
  if (mode == 0x33002) {
    if (handle[0x38] == (GLFWwindow)(value != 0)) {
      return;
    }
    if (value == 0) {
      for (lVar1 = 0x5c; lVar1 != 0x1b9; lVar1 = lVar1 + 1) {
        if (handle[lVar1] == (GLFWwindow)0x3) {
          handle[lVar1] = (GLFWwindow)0x0;
        }
      }
    }
    handle[0x38] = (GLFWwindow)(value != 0);
    return;
  }
  if ((mode != 0x33001) || (value - 0x34004U < 0xfffffffd)) {
    iVar2 = 0x10003;
    goto LAB_001079d5;
  }
  iVar2 = *(int *)(handle + 0x50);
  if (iVar2 == value) {
    return;
  }
  *(int *)(handle + 0x50) = value;
  y = _glfw.cursorPosY;
  x = _glfw.cursorPosX;
  if (_glfw.focusedWindow != (_GLFWwindow *)handle) {
    return;
  }
  if (iVar2 == 0x34003) {
    *(double *)(handle + 0x40) = _glfw.cursorPosX;
    *(double *)(handle + 0x48) = y;
  }
  else {
    if (value != 0x34003) goto LAB_00107adc;
    _glfw.cursorPosX = *(double *)(handle + 0x40);
    _glfw.cursorPosY = *(double *)(handle + 0x48);
    _local_28 = in_RAX;
    _glfwPlatformGetWindowSize((_GLFWwindow *)handle,&width,&stack0xffffffffffffffd8);
    x = (double)width * 0.5;
    y = (double)local_28 * 0.5;
  }
  _glfwPlatformSetCursorPos((_GLFWwindow *)handle,x,y);
LAB_00107adc:
  _glfwPlatformSetCursorMode((_GLFWwindow *)handle,value);
  return;
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT();

    switch (mode)
    {
        case GLFW_CURSOR:
            setCursorMode(window, value);
            break;
        case GLFW_STICKY_KEYS:
            setStickyKeys(window, value ? GL_TRUE : GL_FALSE);
            break;
        case GLFW_STICKY_MOUSE_BUTTONS:
            setStickyMouseButtons(window, value ? GL_TRUE : GL_FALSE);
            break;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, NULL);
            break;
    }
}